

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O1

int picnic_keygen(picnic_params_t param,picnic_publickey_t *pk,picnic_privatekey_t *sk)

{
  byte bVar1;
  int iVar2;
  picnic_instance_t *ppVar3;
  int iVar4;
  
  iVar4 = -1;
  if (sk != (picnic_privatekey_t *)0x0 && pk != (picnic_publickey_t *)0x0) {
    ppVar3 = picnic_instance_get(param);
    if (ppVar3 != (picnic_instance_t *)0x0) {
      bVar1 = ppVar3->input_output_size;
      sk->data[0] = (uint8_t)param;
      iVar2 = rand_bits(sk->data + 1,(ulong)(ppVar3->lowmc).n);
      if (iVar2 == 0) {
        iVar2 = rand_bits(sk->data + (ulong)bVar1 * 2 + 1,(ulong)(ppVar3->lowmc).n);
        if (iVar2 == 0) {
          iVar2 = picnic_sk_to_pk(sk,pk);
          if (iVar2 == 0) {
            memcpy(sk->data + (ulong)bVar1 + 1,pk->data + 1,(ulong)ppVar3->input_output_size);
            iVar4 = 0;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_keygen(picnic_params_t param, picnic_publickey_t* pk,
                                            picnic_privatekey_t* sk) {

  if (!pk || !sk) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  uint8_t* sk_sk = SK_SK(sk);
  uint8_t* sk_pt = SK_PT(sk, instance);
  uint8_t* sk_c  = SK_C(sk, instance);

  // generate private key
  sk->data[0] = param;
  // random secret key
  if (rand_bits(sk_sk, instance->lowmc.n)) {
    return -1;
  }
  // random plain text
  if (rand_bits(sk_pt, instance->lowmc.n)) {
    return -1;
  }
  // encrypt plaintext under secret key
  if (picnic_sk_to_pk(sk, pk)) {
    return -1;
  }
  // copy ciphertext to secret key
  memcpy(sk_c, PK_C(pk), instance->input_output_size);
  return 0;
}